

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O3

void __thiscall
UnixMakefileGenerator::writeDefaultVariables(UnixMakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  QTextStream *pQVar6;
  ProStringList *pPVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QStringView config;
  ProString distname;
  ProKey local_1d8;
  ProString local_1a8;
  ProKey local_178;
  undefined1 local_148 [32];
  undefined1 *local_128;
  undefined1 *puStack_120;
  ProString local_118;
  QString local_e0;
  QString local_c8;
  QArrayData *local_b0 [3];
  ProKey local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::writeDefaultVariables(&this->super_MakefileGenerator,t);
  pQVar6 = (QTextStream *)QTextStream::operator<<(t,"TAR           = ");
  ProKey::ProKey((ProKey *)local_148,"QMAKE_TAR");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_68,this,(ProKey *)local_148);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_68);
  Qt::endl(pQVar6);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
    }
  }
  pQVar6 = (QTextStream *)QTextStream::operator<<(t,"COMPRESS      = ");
  ProKey::ProKey((ProKey *)local_148,"QMAKE_GZIP");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_68,this,(ProKey *)local_148);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_68);
  Qt::endl(pQVar6);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_148,"QMAKE_DISTNAME");
  bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_148);
  if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
    }
  }
  if (bVar5) {
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
    local_148._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_148._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_ORIG_TARGET");
    QMakeEvaluator::first((ProString *)local_148,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar1 = (this->super_MakefileGenerator).project;
    QVar8.m_data = (storage_type *)0xf;
    QVar8.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar8);
    pDVar2 = local_68.m_string.d.d;
    config.m_data = local_68.m_string.d.ptr;
    config.m_size = local_68.m_string.d.size;
    bVar5 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    if (!bVar5) {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_98,"VERSION");
      QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,&local_98);
      ProString::append((ProString *)local_148,&local_68,(bool *)0x0);
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    local_178.super_ProString.m_string.d.d = (Data *)0x0;
    local_178.super_ProString.m_string.d.ptr = (char16_t *)0x0;
    local_178.super_ProString.m_string.d.size = 0;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)&local_178,0,(ProString *)local_148);
    QList<ProString>::end((QList<ProString> *)&local_178);
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_DISTNAME");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
    qVar4 = local_178.super_ProString.m_string.d.size;
    pcVar3 = local_178.super_ProString.m_string.d.ptr;
    pDVar2 = local_178.super_ProString.m_string.d.d;
    local_178.super_ProString.m_string.d.size = 0;
    local_178.super_ProString.m_string.d.d = (Data *)0x0;
    local_178.super_ProString.m_string.d.ptr = (char16_t *)0x0;
    local_98.super_ProString.m_string.d.d = (Data *)(pPVar7->super_QList<ProString>).d.d;
    local_98.super_ProString.m_string.d.ptr = (char16_t *)(pPVar7->super_QList<ProString>).d.ptr;
    (pPVar7->super_QList<ProString>).d.d = (Data *)pDVar2;
    (pPVar7->super_QList<ProString>).d.ptr = (ProString *)pcVar3;
    local_98.super_ProString.m_string.d.size = (pPVar7->super_QList<ProString>).d.size;
    (pPVar7->super_QList<ProString>).d.size = qVar4;
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_98);
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_178);
    if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
      }
    }
  }
  pQVar6 = (QTextStream *)QTextStream::operator<<(t,"DISTNAME      = ");
  ProKey::ProKey((ProKey *)local_148,"QMAKE_DISTNAME");
  MakefileGenerator::fileVar(&local_68.m_string,&this->super_MakefileGenerator,(ProKey *)local_148);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_68);
  Qt::endl(pQVar6);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_148,"QMAKE_DISTDIR");
  bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_148);
  if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
    }
  }
  if (bVar5) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_DISTNAME");
    QMakeEvaluator::first((ProString *)local_148,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
    local_1a8.m_string.d.size = 0;
    local_1a8.m_string.d.d = (Data *)0x0;
    local_1a8.m_string.d.ptr = (char16_t *)0x0;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)&local_1a8,0,(ProString *)local_148);
    QList<ProString>::end((QList<ProString> *)&local_1a8);
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_98,"QMAKE_DISTDIR");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_98);
    qVar4 = local_1a8.m_string.d.size;
    pcVar3 = local_1a8.m_string.d.ptr;
    pDVar2 = local_1a8.m_string.d.d;
    local_1a8.m_string.d.size = 0;
    local_1a8.m_string.d.d = (Data *)0x0;
    local_1a8.m_string.d.ptr = (char16_t *)0x0;
    local_178.super_ProString.m_string.d.d = (Data *)(pPVar7->super_QList<ProString>).d.d;
    local_178.super_ProString.m_string.d.ptr = (char16_t *)(pPVar7->super_QList<ProString>).d.ptr;
    (pPVar7->super_QList<ProString>).d.d = (Data *)pDVar2;
    (pPVar7->super_QList<ProString>).d.ptr = (ProString *)pcVar3;
    local_178.super_ProString.m_string.d.size = (pPVar7->super_QList<ProString>).d.size;
    (pPVar7->super_QList<ProString>).d.size = qVar4;
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_178);
    if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_1a8);
    if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar6 = (QTextStream *)QTextStream::operator<<(t,"DISTDIR = ");
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_98,"OBJECTS_DIR");
  bVar5 = QMakeProject::isEmpty(pQVar1,&local_98);
  if (bVar5) {
    ProString::ProString(&local_68,".tmp/");
  }
  else {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_178,"OBJECTS_DIR");
    QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,&local_178);
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_1d8,"QMAKE_DISTDIR");
  QMakeEvaluator::first(&local_1a8,&pQVar1->super_QMakeEvaluator,&local_1d8);
  ProString::ProString((ProString *)local_148,&local_68);
  ProString::ProString(&local_118,&local_1a8);
  QStringBuilder<ProString,_ProString>::convertTo<QString>
            (&local_e0,(QStringBuilder<ProString,_ProString> *)local_148);
  MakefileGenerator::fileFixify
            (&local_c8,&this->super_MakefileGenerator,&local_e0,(FileFixifyTypes)0x5,true);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
            (local_b0,this,&local_c8);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)local_b0);
  Qt::endl(pQVar6);
  if (local_b0[0] != (QArrayData *)0x0) {
    LOCK();
    (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b0[0],2,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<ProString,_ProString>::~QStringBuilder
            ((QStringBuilder<ProString,_ProString> *)local_148);
  if (&(local_1a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((!bVar5) && (&(local_178.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)
     ) {
    LOCK();
    ((local_178.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_178.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
UnixMakefileGenerator::writeDefaultVariables(QTextStream &t)
{
    MakefileGenerator::writeDefaultVariables(t);
    t << "TAR           = " << var("QMAKE_TAR") << Qt::endl;
    t << "COMPRESS      = " << var("QMAKE_GZIP") << Qt::endl;

    if (project->isEmpty("QMAKE_DISTNAME")) {
        ProString distname = project->first("QMAKE_ORIG_TARGET");
        if (!project->isActiveConfig("no_dist_version"))
            distname += project->first("VERSION");
        project->values("QMAKE_DISTNAME") = distname;
    }
    t << "DISTNAME      = " << fileVar("QMAKE_DISTNAME") << Qt::endl;

    if (project->isEmpty("QMAKE_DISTDIR"))
        project->values("QMAKE_DISTDIR") = project->first("QMAKE_DISTNAME");
    t << "DISTDIR = " << escapeFilePath(fileFixify(
            (project->isEmpty("OBJECTS_DIR") ? ProString(".tmp/") : project->first("OBJECTS_DIR")) + project->first("QMAKE_DISTDIR"),
            FileFixifyFromOutdir | FileFixifyAbsolute)) << Qt::endl;
}